

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O3

void * PointLight_create(void)

{
  PointLight *self;
  undefined4 *puVar1;
  
  puVar1 = (undefined4 *)embree::alignedUSMMalloc(0x40,0x10,DEVICE_READ_ONLY);
  *puVar1 = 1;
  *(undefined8 *)(puVar1 + 4) = 0;
  *(undefined8 *)(puVar1 + 6) = 0;
  *(undefined8 *)(puVar1 + 8) = 0x3f8000003f800000;
  *(undefined8 *)(puVar1 + 10) = 0x3f8000003f800000;
  puVar1[0xc] = 0;
  return puVar1;
}

Assistant:

void* PointLight_create()
{
  PointLight* self = (PointLight*) alignedUSMMalloc(sizeof(PointLight),16);
  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(PointLight_sample);
  //self->super.eval = GET_FUNCTION_POINTER(PointLight_eval);
  self->super.type = LIGHT_POINT;

  PointLight_set(self, Vec3fa(0.f), Vec3fa(1.f), 0.f);
  return self;
}